

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_fs.c
# Opt level: O0

int picnic_l3_fs_sign(picnic_l3_fs_privatekey_t *sk,uint8_t *message,size_t message_len,
                     uint8_t *signature,size_t *signature_len)

{
  int iVar1;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  int ret;
  picnic_context_t context;
  uint8_t *sk_pt;
  uint8_t *sk_c;
  uint8_t *sk_sk;
  picnic_instance_t *instance;
  size_t *in_stack_00000d40;
  uint8_t *in_stack_00000d48;
  picnic_context_t *in_stack_00000d50;
  picnic_instance_t *in_stack_00000d58;
  size_t in_stack_ffffffffffffff08;
  uint8_t *in_stack_ffffffffffffff10;
  mzd_local_t *in_stack_ffffffffffffff18;
  undefined1 auStack_e0 [32];
  long local_c0;
  long local_b8;
  long local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  long local_80;
  long local_78;
  long local_70;
  picnic_instance_t *local_68;
  undefined8 local_50;
  undefined8 local_48;
  long local_40;
  int local_34;
  
  if (((in_RDI == 0) || (in_RCX == 0)) || (in_R8 == 0)) {
    local_34 = -1;
  }
  else {
    local_50 = in_RDX;
    local_48 = in_RSI;
    local_40 = in_RDI;
    local_68 = picnic_instance_get(Picnic_L3_FS);
    if (local_68 == (picnic_instance_t *)0x0) {
      local_34 = -1;
    }
    else {
      local_70 = local_40;
      local_78 = local_40 + 0x18;
      local_80 = local_40 + 0x30;
      mzd_from_char_array(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
      mzd_from_char_array(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
      local_c0 = local_80;
      local_b8 = local_70;
      local_b0 = local_78;
      local_a8 = local_48;
      local_a0 = local_50;
      local_98 = 0;
      iVar1 = picnic_impl_sign(in_stack_00000d58,in_stack_00000d50,in_stack_00000d48,
                               in_stack_00000d40);
      explicit_bzero(auStack_e0,0x20);
      local_34 = iVar1;
    }
  }
  return local_34;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_fs_sign(const picnic_l3_fs_privatekey_t* sk,
                                                const uint8_t* message, size_t message_len,
                                                uint8_t* signature, size_t* signature_len) {
  if (!sk || !signature || !signature_len) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_c  = SK_C(sk);
  const uint8_t* sk_pt = SK_PT(sk);

  picnic_context_t context;
  mzd_from_char_array(context.m_plaintext, sk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(context.m_key, sk_sk, LOWMC_BLOCK_SZ);
  context.plaintext   = sk_pt;
  context.private_key = sk_sk;
  context.public_key  = sk_c;
  context.msg         = message;
  context.msglen      = message_len;
#if defined(WITH_UNRUH)
  context.unruh = (PARAM == Picnic_L1_UR || PARAM == Picnic_L3_UR || PARAM == Picnic_L5_UR);
#endif
  int ret = picnic_impl_sign(instance, &context, signature, signature_len);
  picnic_explicit_bzero(context.m_key, sizeof(context.m_key));
  return ret;
}